

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::Texture2DArrayView::sample
          (Texture2DArrayView *this,Sampler *sampler,float s,float t,float r,float lod)

{
  WrapMode WVar1;
  undefined4 numLevels;
  int in_EDX;
  Vec4 VVar2;
  
  numLevels = sampler->wrapR;
  WVar1 = sampler->wrapS;
  selectLayer((Texture2DArrayView *)sampler,r);
  VVar2 = sampleLevelArray2D((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)WVar1,s,t,
                             in_EDX,lod);
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 Texture2DArrayView::sample (const Sampler& sampler, float s, float t, float r, float lod) const
{
	return sampleLevelArray2D(m_levels, m_numLevels, sampler, s, t, selectLayer(r), lod);
}